

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O1

void * __thiscall camp::UserObject::pointer(UserObject *this)

{
  element_type *peVar1;
  ParentObject *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  void *pvVar4;
  UserObject local_70;
  Value local_48;
  
  peVar1 = (this->m_holder).
           super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (peVar1 != (element_type *)0x0) {
    iVar3 = (*peVar1->_vptr_AbstractObjectHolder[2])();
    return (void *)CONCAT44(extraout_var,iVar3);
  }
  pPVar2 = (this->m_parent).px;
  if (pPVar2 == (ParentObject *)0x0) {
    return (void *)0x0;
  }
  Property::get(&local_48,&pPVar2->member->super_Property,&pPVar2->object);
  Value::to<camp::UserObject>(&local_70,&local_48);
  pPVar2 = (this->m_parent).px;
  if (pPVar2 != (ParentObject *)0x0) {
    operator=(&pPVar2->lastValue,&local_70);
    ~UserObject(&local_70);
    boost::
    variant<camp::NoType,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_camp::EnumObject,_camp::UserObject>
    ::destroy_content(&local_48.m_value);
    pPVar2 = (this->m_parent).px;
    if (pPVar2 != (ParentObject *)0x0) {
      pvVar4 = pointer(&pPVar2->lastValue);
      return pvVar4;
    }
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/scoped_ptr.hpp",0x69,
                "T *boost::scoped_ptr<camp::ParentObject>::operator->() const [T = camp::ParentObject]"
               );
}

Assistant:

void* UserObject::pointer() const
{
    if (m_holder)
    {
        return m_holder->object();
    }
    else if (m_parent)
    {
        // warning: this may not be multi-thread safe,
        // but it is required to make the returned value persistent
        m_parent->lastValue = m_parent->member.get(m_parent->object).to<UserObject>();
        return m_parent->lastValue.pointer();
    }
    else
    {
        return 0;
    }
}